

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float fVar1;
  float x0;
  float y0;
  ImVec2 IVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  ImFont *pIVar7;
  ImFont **ppIVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int off_y_1;
  long lVar12;
  uchar *puVar13;
  uint *puVar14;
  ulong uVar15;
  int off_x;
  ulong uVar16;
  ImFontAtlasCustomRect *pIVar17;
  uint uVar18;
  char *pcVar19;
  uint *puVar20;
  int off_y;
  int iVar21;
  uint uVar22;
  bool bVar23;
  int off_y_2;
  int off_x_2;
  uint uVar24;
  long lVar25;
  int iVar26;
  size_t __n;
  float fVar27;
  int local_7c;
  size_t local_58;
  
  iVar11 = atlas->PackIdMouseCursors;
  pIVar17 = (atlas->CustomRects).Data;
  lVar12 = (long)atlas->TexWidth;
  uVar15 = (ulong)pIVar17[iVar11].X;
  if ((atlas->Flags & 2) == 0) {
    uVar16 = (ulong)pIVar17[iVar11].Y;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar20 = atlas->TexPixelsRGBA32;
      puVar14 = puVar20 + (ulong)pIVar17[iVar11].X + lVar12 * uVar16;
      pcVar19 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar21 = 0;
      do {
        lVar12 = 0;
        do {
          puVar14[lVar12] = -(uint)(pcVar19[lVar12] == '.');
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x6c);
        iVar21 = iVar21 + 1;
        puVar14 = puVar14 + atlas->TexWidth;
        pcVar19 = pcVar19 + 0x6c;
      } while (iVar21 != 0x1b);
      puVar20 = puVar20 + uVar15 + 0x6d + (long)atlas->TexWidth * uVar16;
      pcVar19 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar21 = 0;
      do {
        lVar12 = 0;
        do {
          puVar20[lVar12] = -(uint)(pcVar19[lVar12] == 'X');
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x6c);
        iVar21 = iVar21 + 1;
        puVar20 = puVar20 + atlas->TexWidth;
        pcVar19 = pcVar19 + 0x6c;
      } while (iVar21 != 0x1b);
    }
    else {
      puVar13 = atlas->TexPixelsAlpha8 + lVar12 * uVar16 + uVar15;
      pcVar19 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar21 = 0;
      do {
        lVar12 = 0;
        do {
          puVar13[lVar12] = -(pcVar19[lVar12] == '.');
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x6c);
        iVar21 = iVar21 + 1;
        puVar13 = puVar13 + atlas->TexWidth;
        pcVar19 = pcVar19 + 0x6c;
      } while (iVar21 != 0x1b);
      puVar13 = atlas->TexPixelsAlpha8 +
                (long)atlas->TexWidth * (ulong)pIVar17[iVar11].Y + uVar15 + 0x6d;
      pcVar19 = 
      "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
      ;
      iVar21 = 0;
      do {
        lVar12 = 0;
        do {
          puVar13[lVar12] = -(pcVar19[lVar12] == 'X');
          lVar12 = lVar12 + 1;
        } while (lVar12 != 0x6c);
        iVar21 = iVar21 + 1;
        puVar13 = puVar13 + atlas->TexWidth;
        pcVar19 = pcVar19 + 0x6c;
      } while (iVar21 != 0x1b);
    }
  }
  else {
    lVar25 = (ulong)pIVar17[iVar11].Y * lVar12 + uVar15;
    iVar21 = (int)lVar25;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar20 = atlas->TexPixelsRGBA32;
      puVar14 = puVar20 + (atlas->TexWidth + iVar21);
      puVar14[0] = 0xffffffff;
      puVar14[1] = 0xffffffff;
      puVar20 = puVar20 + iVar21;
      puVar20[0] = 0xffffffff;
      puVar20[1] = 0xffffffff;
    }
    else {
      lVar12 = iVar21 + lVar12;
      atlas->TexPixelsAlpha8[lVar12 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar12] = 0xff;
      atlas->TexPixelsAlpha8[lVar25 + 1] = 0xff;
      atlas->TexPixelsAlpha8[lVar25] = 0xff;
    }
  }
  uVar10._0_2_ = pIVar17[iVar11].X;
  uVar10._2_2_ = pIVar17[iVar11].Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar10 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar10 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar17 = (atlas->CustomRects).Data + atlas->PackIdLines;
    local_58 = 0;
    lVar12 = -0x40;
    local_7c = 0;
    iVar11 = 0;
    do {
      uVar3 = pIVar17->Width;
      uVar10 = iVar11 + (uint)uVar3;
      uVar24 = uVar10 >> 1;
      iVar21 = (int)lVar12;
      uVar18 = uVar24 + 0x40 + iVar21;
      iVar26 = (uVar3 - uVar24) + iVar11;
      puVar13 = atlas->TexPixelsAlpha8;
      if (puVar13 == (uchar *)0x0) {
        puVar20 = atlas->TexPixelsRGBA32;
        uVar4 = pIVar17->X;
        uVar5 = pIVar17->Y;
        iVar6 = atlas->TexWidth;
        puVar14 = puVar20 + (((uint)uVar5 + iVar21 + 0x40) * iVar6 + (uint)uVar4);
        if (1 < uVar10) {
          memset(puVar14,0,(ulong)uVar24 << 2);
        }
        if (lVar12 != -0x40) {
          memset(puVar14 + uVar24,0xff,local_58);
        }
        if (uVar18 != uVar3) {
          puVar20 = puVar20 + (ulong)uVar24 +
                              (ulong)(iVar6 * ((uint)uVar5 + local_7c) + (uint)uVar4) +
                              lVar12 + 0x40;
          __n = (ulong)(iVar26 + (uint)(iVar26 == 0)) << 2;
          goto LAB_0013a5ce;
        }
      }
      else {
        uVar4 = pIVar17->X;
        uVar5 = pIVar17->Y;
        iVar6 = atlas->TexWidth;
        if (1 < uVar10) {
          memset(puVar13 + (((uint)uVar5 + iVar21 + 0x40) * iVar6 + (uint)uVar4),0,(ulong)uVar24);
        }
        if (lVar12 != -0x40) {
          memset(puVar13 + (((uint)uVar5 + iVar21 + 0x40) * iVar6 + (uint)uVar4) + uVar24,0xff,
                 lVar12 + 0x40);
        }
        if (uVar18 != uVar3) {
          puVar20 = (uint *)(puVar13 +
                            lVar12 + (ulong)(iVar6 * ((uint)uVar5 + local_7c) + (uint)uVar4) +
                                     (ulong)uVar24 + 0x40);
          __n = (size_t)(iVar26 + (uint)(iVar26 == 0));
LAB_0013a5ce:
          memset(puVar20,0,__n);
        }
      }
      uVar3 = pIVar17->X;
      uVar4 = pIVar17->Y;
      fVar1 = (atlas->TexUvScale).x;
      fVar27 = (atlas->TexUvScale).y;
      (&atlas->TexUvLines[0].x)[local_58] = (float)((uVar3 + uVar24) - 1) * fVar1;
      fVar27 = ((float)(int)(iVar21 + 0x41 + (uint)uVar4) * fVar27 +
               (float)(int)(iVar21 + 0x40 + (uint)uVar4) * fVar27) * 0.5;
      *(ulong *)(&atlas->TexUvLines[0].y + local_58) =
           CONCAT44(fVar1 * (float)(iVar21 + 0x41 + uVar24 + uVar3),fVar27);
      (&atlas->TexUvLines[0].w)[local_58] = fVar27;
      iVar11 = iVar11 + -1;
      local_7c = local_7c + 1;
      local_58 = local_58 + 4;
      lVar12 = lVar12 + 1;
    } while (lVar12 != 0);
  }
  iVar11 = (atlas->CustomRects).Size;
  if (0 < iVar11) {
    lVar12 = 0;
    lVar25 = 0;
    do {
      pIVar17 = (atlas->CustomRects).Data;
      pIVar7 = *(ImFont **)((long)&pIVar17->Font + lVar12);
      if ((pIVar7 != (ImFont *)0x0) &&
         (iVar21 = *(int *)((long)&pIVar17->GlyphID + lVar12), iVar21 != 0)) {
        uVar10 = (uint)*(ushort *)((long)&pIVar17->X + lVar12);
        fVar1 = (atlas->TexUvScale).x;
        fVar27 = (atlas->TexUvScale).y;
        uVar24 = (uint)*(ushort *)((long)&pIVar17->Y + lVar12);
        uVar22 = (uint)*(ushort *)((long)&pIVar17->Width + lVar12);
        uVar18 = (uint)*(ushort *)((long)&pIVar17->Height + lVar12);
        x0 = *(float *)((long)&(pIVar17->GlyphOffset).x + lVar12);
        y0 = *(float *)((long)&(pIVar17->GlyphOffset).y + lVar12);
        ImFont::AddGlyph(pIVar7,(ImFontConfig *)0x0,(ImWchar)iVar21,x0,y0,(float)uVar22 + x0,
                         (float)uVar18 + y0,(float)uVar10 * fVar1,(float)uVar24 * fVar27,
                         (float)(uVar10 + uVar22) * fVar1,(float)(uVar24 + uVar18) * fVar27,
                         *(float *)((long)&pIVar17->GlyphAdvanceX + lVar12));
        iVar11 = (atlas->CustomRects).Size;
      }
      lVar25 = lVar25 + 1;
      lVar12 = lVar12 + 0x20;
    } while (lVar25 < iVar11);
  }
  uVar10 = (atlas->Fonts).Size;
  if (0 < (int)uVar10) {
    lVar12 = 0;
    do {
      pIVar7 = (atlas->Fonts).Data[lVar12];
      if (pIVar7->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(pIVar7);
        uVar10 = (atlas->Fonts).Size;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar10);
    if (0 < (int)uVar10) {
      ppIVar8 = (atlas->Fonts).Data;
      uVar15 = 0;
      do {
        pIVar7 = ppIVar8[uVar15];
        if (pIVar7->EllipsisChar == 0xffff) {
          lVar12 = 0;
          bVar9 = true;
          do {
            bVar23 = bVar9;
            uVar3 = (&DAT_001686a4)[lVar12];
            if ((((ulong)uVar3 < (ulong)(long)(pIVar7->IndexLookup).Size) &&
                ((pIVar7->IndexLookup).Data[uVar3] != 0xffff)) &&
               ((pIVar7->Glyphs).Data != (ImFontGlyph *)0x0)) {
              pIVar7->EllipsisChar = uVar3;
              break;
            }
            lVar12 = 1;
            bVar9 = false;
          } while (bVar23);
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar10);
    }
  }
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldom included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}